

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O3

void __thiscall
common_arg::common_arg
          (common_arg *this,initializer_list<const_char_*> *args,char *value_hint,string *help,
          _func_void_common_params_ptr_string_ptr *handler)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  uint in_EAX;
  initializer_list<llama_example> __l;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&uStack_38 + 4);
  std::set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_>::set
            (&this->examples,__l,(less<llama_example> *)((long)&uStack_38 + 3),
             (allocator_type *)((long)&uStack_38 + 2));
  p_Var1 = &(this->excludes)._M_t._M_impl.super__Rb_tree_header;
  (this->excludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->excludes)._M_t._M_impl = 0;
  *(undefined8 *)&(this->excludes)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->excludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->excludes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->excludes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&this->args,*args,(allocator_type *)((long)&uStack_38 + 1));
  this->value_hint = value_hint;
  this->value_hint_2 = (char *)0x0;
  this->env = (char *)0x0;
  (this->help)._M_dataplus._M_p = (pointer)&(this->help).field_2;
  pcVar2 = (help->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->help,pcVar2,pcVar2 + help->_M_string_length);
  this->is_sparam = false;
  this->handler_void = (_func_void_common_params_ptr *)0x0;
  this->handler_string = handler;
  this->handler_str_str = (_func_void_common_params_ptr_string_ptr_string_ptr *)0x0;
  this->handler_int = (_func_void_common_params_ptr_int *)0x0;
  return;
}

Assistant:

common_arg(
        const std::initializer_list<const char *> & args,
        const char * value_hint,
        const std::string & help,
        void (*handler)(common_params & params, const std::string &)
    ) : args(args), value_hint(value_hint), help(help), handler_string(handler) {}